

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_pipeline_layouts
          (Impl *this,StateCreatorInterface *iface,Value *layouts)

{
  VkPipelineLayoutCreateInfo *pVVar1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint64_t uVar2;
  VkPipelineLayoutCreateInfo *pVVar3;
  bool bVar4;
  SizeType SVar5;
  uint uVar6;
  int iVar7;
  ConstMemberIterator this_01;
  ConstMemberIterator CVar8;
  Ch *str;
  size_type sVar9;
  Type pGVar10;
  mapped_type *ppVVar11;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  int iVar12;
  ulong uVar13;
  Hash hash;
  uint64_t local_68;
  int local_5c;
  Impl *local_58;
  StateCreatorInterface *local_50;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_48;
  VkPipelineLayoutCreateInfo *local_40;
  Value *local_38;
  
  local_50 = iface;
  SVar5 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberCount(layouts);
  local_40 = ScratchAllocator::allocate_n_cleared<VkPipelineLayoutCreateInfo>
                       (&this->allocator,(ulong)SVar5);
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberBegin(layouts);
  this_02 = &(this->replayed_pipeline_layouts)._M_h;
  uVar13 = 0;
  local_58 = this;
  local_48 = this_02;
  local_38 = layouts;
  while( true ) {
    iVar12 = (int)uVar13;
    CVar8 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::MemberEnd(layouts);
    if (this_01.ptr_ == CVar8.ptr_) break;
    str = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString(&(this_01.ptr_)->name);
    local_68 = string_to_uint64(str);
    sVar9 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(this_02,&local_68);
    pVVar3 = local_40;
    if (sVar9 == 0) {
      this_00 = &(this_01.ptr_)->value;
      pVVar1 = local_40 + uVar13;
      local_40[uVar13].sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      pGVar10 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>
                          ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                            *)this_00,"flags");
      uVar6 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(pGVar10);
      pVVar3[uVar13].flags = uVar6;
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"pushConstantRanges");
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"pushConstantRanges");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->pushConstantRangeCount = SVar5;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"pushConstantRanges");
        parse_push_constant_ranges(local_58,pGVar10,&pVVar1->pPushConstantRanges);
      }
      bVar4 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(this_00,"setLayouts");
      layouts = local_38;
      this_02 = local_48;
      if (bVar4) {
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"setLayouts");
        SVar5 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(pGVar10);
        pVVar1->setLayoutCount = SVar5;
        local_5c = iVar12;
        pGVar10 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  ::operator[]<char_const>
                            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                              *)this_00,"setLayouts");
        iVar12 = local_5c;
        bVar4 = parse_set_layouts(local_58,pGVar10,&pVVar1->pSetLayouts);
        if (!bVar4) goto LAB_00141ccf;
      }
      uVar2 = local_68;
      ppVVar11 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_VkPipelineLayout_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkPipelineLayout_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_02,&local_68);
      iVar7 = (*local_50->_vptr_StateCreatorInterface[7])(local_50,uVar2,pVVar1,ppVVar11);
      if ((char)iVar7 == '\0') goto LAB_00141ccf;
    }
    this_01.ptr_ = this_01.ptr_ + 1;
    uVar13 = (ulong)(iVar12 + 1);
  }
  (*local_50->_vptr_StateCreatorInterface[0x11])();
LAB_00141ccf:
  return this_01.ptr_ == CVar8.ptr_;
}

Assistant:

bool StateReplayer::Impl::parse_pipeline_layouts(StateCreatorInterface &iface, const Value &layouts)
{
	auto *infos = allocator.allocate_n_cleared<VkPipelineLayoutCreateInfo>(layouts.MemberCount());

	unsigned index = 0;
	for (auto itr = layouts.MemberBegin(); itr != layouts.MemberEnd(); ++itr, index++)
	{
		Hash hash = string_to_uint64(itr->name.GetString());
		if (replayed_pipeline_layouts.count(hash))
			continue;
		auto &obj = itr->value;
		auto &info = infos[index];
		info.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;

		info.flags = obj["flags"].GetUint();

		if (obj.HasMember("pushConstantRanges"))
		{
			info.pushConstantRangeCount = obj["pushConstantRanges"].Size();
			if (!parse_push_constant_ranges(obj["pushConstantRanges"], &info.pPushConstantRanges))
				return false;
		}

		if (obj.HasMember("setLayouts"))
		{
			info.setLayoutCount = obj["setLayouts"].Size();
			if (!parse_set_layouts(obj["setLayouts"], &info.pSetLayouts))
				return false;
		}

		if (!iface.enqueue_create_pipeline_layout(hash, &info, &replayed_pipeline_layouts[hash]))
			return false;
	}

	iface.notify_replayed_resources_for_type();
	return true;
}